

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableEnumFieldLiteGenerator::GenerateParsingCode
          (ImmutableEnumFieldLiteGenerator *this,Printer *printer)

{
  bool bVar1;
  FileDescriptor *descriptor;
  Descriptor *descriptor_00;
  Printer *printer_local;
  ImmutableEnumFieldLiteGenerator *this_local;
  
  descriptor = FieldDescriptor::file(this->descriptor_);
  bVar1 = SupportUnknownEnumValue(descriptor);
  if (bVar1) {
    io::Printer::Print(printer,&this->variables_,
                       "int rawValue = input.readEnum();\n$set_has_field_bit_message$\n$name$_ = rawValue;\n"
                      );
  }
  else {
    io::Printer::Print(printer,&this->variables_,
                       "int rawValue = input.readEnum();\n$type$ value = $type$.forNumber(rawValue);\nif (value == null) {\n"
                      );
    descriptor_00 = FieldDescriptor::containing_type(this->descriptor_);
    bVar1 = PreserveUnknownFields(descriptor_00);
    if (bVar1) {
      io::Printer::Print(printer,&this->variables_,"  super.mergeVarintField($number$, rawValue);\n"
                        );
    }
    io::Printer::Print(printer,&this->variables_,
                       "} else {\n  $set_has_field_bit_message$\n  $name$_ = rawValue;\n}\n");
  }
  return;
}

Assistant:

void ImmutableEnumFieldLiteGenerator::
GenerateParsingCode(io::Printer* printer) const {
  if (SupportUnknownEnumValue(descriptor_->file())) {
    printer->Print(variables_,
      "int rawValue = input.readEnum();\n"
      "$set_has_field_bit_message$\n"
      "$name$_ = rawValue;\n");
  } else {
    printer->Print(variables_,
      "int rawValue = input.readEnum();\n"
      "$type$ value = $type$.forNumber(rawValue);\n"
      "if (value == null) {\n");
    if (PreserveUnknownFields(descriptor_->containing_type())) {
      printer->Print(variables_,
        "  super.mergeVarintField($number$, rawValue);\n");
    }
    printer->Print(variables_,
      "} else {\n"
      "  $set_has_field_bit_message$\n"
      "  $name$_ = rawValue;\n"
      "}\n");
  }
}